

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

_Bool remove_expired_twin_operation_request
                (void *item,void *match_context,_Bool *continue_processing)

{
  long lVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  double dVar4;
  
  if ((match_context == (void *)0x0 || item == (void *)0x0) || continue_processing == (_Bool *)0x0)
  {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return false;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"remove_expired_twin_operation_request",0x406,1,
              "Invalid argument (item=%p, match_context=%p, continue_processing=%p)",item,
              match_context,continue_processing);
    return false;
  }
  lVar1 = *(long *)((long)item + 8);
  dVar4 = get_difftime(*match_context,*(time_t *)((long)item + 0x28));
  if (dVar4 < 300.0) {
    *continue_processing = false;
    return false;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    if ((ulong)*item < 6) {
      pcVar3 = TWIN_OPERATION_TYPEStringStorage[*item];
    }
    else {
      pcVar3 = "NULL";
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"remove_expired_twin_operation_request",0x417,1,
              "Twin operation timed out (%s, %s, %s)",*(undefined8 *)(lVar1 + 0x10),pcVar3,
              *(undefined8 *)((long)item + 0x10));
  }
  *continue_processing = true;
  switch(*item) {
  case 1:
    if (*(code **)((long)item + 0x18) != (code *)0x0) {
      (**(code **)((long)item + 0x18))(1,3,0,*(undefined8 *)((long)item + 0x20));
    }
    goto switchD_0013a9db_default;
  case 2:
    if (*(int *)(lVar1 + 0x50) != 3) goto switchD_0013a9db_default;
    *(undefined4 *)(lVar1 + 0x50) = 2;
    break;
  case 3:
    (**(code **)((long)item + 0x18))(1,0,0,*(undefined8 *)((long)item + 0x20));
    goto switchD_0013a9db_default;
  case 4:
    if (*(int *)(lVar1 + 0x50) != 5) goto switchD_0013a9db_default;
    *(undefined4 *)(lVar1 + 0x50) = 4;
    break;
  case 5:
    if (*(int *)(lVar1 + 0x50) != 8) goto switchD_0013a9db_default;
    *(undefined4 *)(lVar1 + 0x50) = 7;
    break;
  default:
    goto switchD_0013a9db_default;
  }
  *(long *)(lVar1 + 0x58) = *(long *)(lVar1 + 0x58) + 1;
switchD_0013a9db_default:
  destroy_twin_operation_context((TWIN_OPERATION_CONTEXT *)item);
  return true;
}

Assistant:

static bool remove_expired_twin_operation_request(const void* item, const void* match_context, bool* continue_processing)
{
    bool result;

    if (item == NULL || match_context == NULL || continue_processing == NULL)
    {
        LogError("Invalid argument (item=%p, match_context=%p, continue_processing=%p)", item, match_context, continue_processing);
        result = false;
    }
    else
    {
        TWIN_OPERATION_CONTEXT* twin_op_ctx = (TWIN_OPERATION_CONTEXT*)item;
        TWIN_MESSENGER_INSTANCE* twin_msgr = twin_op_ctx->msgr;
        time_t current_time = *(time_t*)match_context;

        if (get_difftime(current_time, twin_op_ctx->time_sent) < DEFAULT_TWIN_OPERATION_TIMEOUT_SECS)
        {
            result = false;
            // All next elements in the list have a later time_sent, so they won't be expired, and don't need to be removed.
            *continue_processing = false;
        }
        else
        {
            LogError("Twin operation timed out (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, twin_op_ctx->type), twin_op_ctx->correlation_id);
            result = true;
            *continue_processing = true;

            if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
            {
                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                {
                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_TIMEOUT, 0, twin_op_ctx->cb.reported_properties.context);
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET)
            {
                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                {
                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                    twin_msgr->subscription_error_count++;
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT)
            {
                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBING)
                {
                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                    twin_msgr->subscription_error_count++;
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_DELETE)
            {
                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING)
                {
                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
                    twin_msgr->subscription_error_count++;
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
            {
                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->cb.get_twin.context);
            }

            destroy_twin_operation_context(twin_op_ctx);
        }
    }

    return result;
}